

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactSMC.h
# Opt level: O1

void __thiscall
chrono::ChContactSMC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_3vars<3,_3,_3>_>::
CalculateJacobians(ChContactSMC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_3vars<3,_3,_3>_>
                   *this,ChMaterialCompositeSMC *mat)

{
  ChContactable_3vars<3,_3,_3> *pCVar1;
  ChContactJacobian *pCVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  double *pdVar7;
  Index size;
  long lVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  ChVectorDynamic<> Q1;
  ChVectorDynamic<> Q0;
  ChStateDelta stateA_w;
  ChStateDelta stateB_w;
  ChState stateA_x;
  ChStateDelta prtrbB;
  ChStateDelta prtrbA;
  ChState stateB_x;
  ChState stateB_x1;
  ChState stateA_x1;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_138;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_128;
  ulong local_110;
  long local_108;
  ChStateDelta local_100;
  ChStateDelta local_e8;
  ChState local_d0;
  ChStateDelta local_b8;
  ChStateDelta local_a0;
  ChState local_88;
  ulong local_70;
  long local_68;
  ChState local_60;
  ChState local_48;
  
  iVar4 = (*(((this->
              super_ChContactTuple<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_3vars<3,_3,_3>_>
              ).objA)->super_ChContactable)._vptr_ChContactable[3])();
  uVar5 = (*(((this->
              super_ChContactTuple<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_3vars<3,_3,_3>_>
              ).objA)->super_ChContactable)._vptr_ChContactable[4])();
  ChState::ChState(&local_d0,(long)iVar4,(ChIntegrable *)0x0);
  local_108 = (long)(int)uVar5;
  local_110 = (ulong)uVar5;
  ChStateDelta::ChStateDelta(&local_100,local_108,(ChIntegrable *)0x0);
  pCVar1 = (this->
           super_ChContactTuple<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_3vars<3,_3,_3>_>
           ).objA;
  (*(pCVar1->super_ChContactable)._vptr_ChContactable[5])(pCVar1,&local_d0);
  pCVar1 = (this->
           super_ChContactTuple<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_3vars<3,_3,_3>_>
           ).objA;
  (*(pCVar1->super_ChContactable)._vptr_ChContactable[6])(pCVar1,&local_100);
  iVar6 = (*(((this->
              super_ChContactTuple<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_3vars<3,_3,_3>_>
              ).objB)->super_ChContactable)._vptr_ChContactable[3])();
  uVar5 = (*(((this->
              super_ChContactTuple<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_3vars<3,_3,_3>_>
              ).objB)->super_ChContactable)._vptr_ChContactable[4])();
  local_68 = (long)iVar4;
  ChState::ChState(&local_88,(long)iVar6,(ChIntegrable *)0x0);
  ChStateDelta::ChStateDelta(&local_e8,(long)(int)uVar5,(ChIntegrable *)0x0);
  pCVar1 = (this->
           super_ChContactTuple<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_3vars<3,_3,_3>_>
           ).objB;
  (*(pCVar1->super_ChContactable)._vptr_ChContactable[5])(pCVar1,&local_88);
  pCVar1 = (this->
           super_ChContactTuple<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_3vars<3,_3,_3>_>
           ).objB;
  (*(pCVar1->super_ChContactable)._vptr_ChContactable[6])(pCVar1,&local_e8);
  local_128.m_storage.m_data = (double *)0x0;
  local_128.m_storage.m_rows = 0;
  lVar11 = (long)(int)((int)local_110 + uVar5);
  local_70 = (ulong)uVar5;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_128,lVar11);
  CalculateQ(this,&local_d0,&local_100,&local_88,&local_e8,mat,(ChVectorDynamic<> *)&local_128);
  ChState::ChState(&local_48,local_68,(ChIntegrable *)0x0);
  ChState::ChState(&local_60,(long)iVar6,(ChIntegrable *)0x0);
  ChStateDelta::ChStateDelta(&local_a0,local_108,(ChIntegrable *)0x0);
  ChStateDelta::ChStateDelta(&local_b8,(long)(int)uVar5,(ChIntegrable *)0x0);
  local_138.m_storage.m_data = (double *)0x0;
  local_138.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_138,lVar11);
  if (0 < (int)local_110) {
    lVar9 = 0;
    lVar11 = 0;
    do {
      if (local_a0.super_ChVectorDynamic<double>.
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows <= lVar11)
      goto LAB_0057f583;
      local_a0.super_ChVectorDynamic<double>.
      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[lVar11] =
           local_a0.super_ChVectorDynamic<double>.
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[lVar11] +
           1e-05;
      pCVar1 = (this->
               super_ChContactTuple<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_3vars<3,_3,_3>_>
               ).objA;
      (*(pCVar1->super_ChContactable)._vptr_ChContactable[7])(pCVar1,&local_d0,&local_a0,&local_48);
      CalculateQ(this,&local_48,&local_100,&local_88,&local_e8,mat,(ChVectorDynamic<> *)&local_138);
      if (local_a0.super_ChVectorDynamic<double>.
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows <= lVar11)
      goto LAB_0057f583;
      local_a0.super_ChVectorDynamic<double>.
      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[lVar11] =
           local_a0.super_ChVectorDynamic<double>.
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[lVar11] +
           -1e-05;
      if (local_138.m_storage.m_rows != local_128.m_storage.m_rows) goto LAB_0057f5a2;
      if (local_128.m_storage.m_rows < 0) goto LAB_0057f61e;
      pCVar2 = this->m_Jac;
      pdVar7 = (pCVar2->m_K).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_data;
      lVar12 = (pCVar2->m_K).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_rows;
      if (lVar12 < 0 && pdVar7 != (double *)0x0) goto LAB_0057f5ff;
      lVar3 = (pCVar2->m_K).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_cols;
      if (lVar3 <= lVar11) goto LAB_0057f5e0;
      if (lVar12 != local_128.m_storage.m_rows) goto LAB_0057f5c1;
      if (0 < lVar12) {
        pdVar7 = (double *)((long)pdVar7 + lVar9);
        lVar8 = 0;
        do {
          *pdVar7 = (local_138.m_storage.m_data[lVar8] - local_128.m_storage.m_data[lVar8]) *
                    -99999.99999999999;
          lVar8 = lVar8 + 1;
          pdVar7 = pdVar7 + lVar3;
        } while (lVar12 != lVar8);
      }
      if (local_100.super_ChVectorDynamic<double>.
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows <= lVar11)
      goto LAB_0057f583;
      local_100.super_ChVectorDynamic<double>.
      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[lVar11] =
           local_100.super_ChVectorDynamic<double>.
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[lVar11] +
           1e-05;
      CalculateQ(this,&local_d0,&local_100,&local_88,&local_e8,mat,(ChVectorDynamic<> *)&local_138);
      if (local_100.super_ChVectorDynamic<double>.
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows <= lVar11)
      goto LAB_0057f583;
      local_100.super_ChVectorDynamic<double>.
      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[lVar11] =
           local_100.super_ChVectorDynamic<double>.
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[lVar11] +
           -1e-05;
      if (local_138.m_storage.m_rows != local_128.m_storage.m_rows) goto LAB_0057f5a2;
      if (local_128.m_storage.m_rows < 0) goto LAB_0057f61e;
      pCVar2 = this->m_Jac;
      pdVar7 = (pCVar2->m_R).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_data;
      lVar12 = (pCVar2->m_R).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_rows;
      if (lVar12 < 0 && pdVar7 != (double *)0x0) goto LAB_0057f5ff;
      lVar3 = (pCVar2->m_R).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_cols;
      if (lVar3 <= lVar11) goto LAB_0057f5e0;
      if (lVar12 != local_128.m_storage.m_rows) goto LAB_0057f5c1;
      if (0 < lVar12) {
        pdVar7 = (double *)((long)pdVar7 + lVar9);
        lVar8 = 0;
        do {
          *pdVar7 = (local_138.m_storage.m_data[lVar8] - local_128.m_storage.m_data[lVar8]) *
                    -99999.99999999999;
          lVar8 = lVar8 + 1;
          pdVar7 = pdVar7 + lVar3;
        } while (lVar12 != lVar8);
      }
      lVar11 = lVar11 + 1;
      lVar9 = lVar9 + 8;
    } while (lVar11 != local_108);
  }
  if (0 < (int)local_70) {
    local_110 = local_70 & 0xffffffff;
    lVar11 = local_108 * 8;
    uVar10 = 0;
    do {
      if (local_b8.super_ChVectorDynamic<double>.
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows <=
          (long)uVar10) {
LAB_0057f583:
        __assert_fail("index >= 0 && index < size()",
                      "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                     );
      }
      local_b8.super_ChVectorDynamic<double>.
      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[uVar10] =
           local_b8.super_ChVectorDynamic<double>.
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[uVar10] +
           1e-05;
      pCVar1 = (this->
               super_ChContactTuple<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_3vars<3,_3,_3>_>
               ).objB;
      (*(pCVar1->super_ChContactable)._vptr_ChContactable[7])(pCVar1,&local_88,&local_b8,&local_60);
      CalculateQ(this,&local_d0,&local_100,&local_60,&local_e8,mat,(ChVectorDynamic<> *)&local_138);
      if (local_b8.super_ChVectorDynamic<double>.
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows <=
          (long)uVar10) goto LAB_0057f583;
      local_b8.super_ChVectorDynamic<double>.
      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[uVar10] =
           local_b8.super_ChVectorDynamic<double>.
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[uVar10] +
           -1e-05;
      if (local_138.m_storage.m_rows != local_128.m_storage.m_rows) {
LAB_0057f5a2:
        __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                      "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,
                      "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::Matrix<double, -1, 1>]"
                     );
      }
      if (local_128.m_storage.m_rows < 0) {
LAB_0057f61e:
        __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                      ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                      "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, 1>]"
                     );
      }
      pCVar2 = this->m_Jac;
      pdVar7 = (pCVar2->m_K).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_data;
      lVar9 = (pCVar2->m_K).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows;
      if (lVar9 < 0 && pdVar7 != (double *)0x0) {
LAB_0057f5ff:
        __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                      ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                      "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, -1, 1>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, -1, 1>, Level = 0]"
                     );
      }
      lVar12 = uVar10 + local_108;
      if ((lVar12 < 0) ||
         (lVar3 = (pCVar2->m_K).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_cols, lVar3 <= lVar12)) {
LAB_0057f5e0:
        __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                      ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x7a,
                      "Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, -1, 1>::Block(XprType &, Index) [XprType = Eigen::Matrix<double, -1, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                     );
      }
      if (lVar9 != local_128.m_storage.m_rows) {
LAB_0057f5c1:
        __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                      ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                      "void Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, -1, 1>>::resize(Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, -1, 1>]"
                     );
      }
      if (0 < lVar9) {
        pdVar7 = (double *)((long)pdVar7 + lVar11);
        lVar8 = 0;
        do {
          *pdVar7 = (local_138.m_storage.m_data[lVar8] - local_128.m_storage.m_data[lVar8]) *
                    -99999.99999999999;
          lVar8 = lVar8 + 1;
          pdVar7 = pdVar7 + lVar3;
        } while (lVar9 != lVar8);
      }
      if (local_e8.super_ChVectorDynamic<double>.
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows <=
          (long)uVar10) goto LAB_0057f583;
      local_e8.super_ChVectorDynamic<double>.
      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[uVar10] =
           local_e8.super_ChVectorDynamic<double>.
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[uVar10] +
           1e-05;
      CalculateQ(this,&local_d0,&local_100,&local_88,&local_e8,mat,(ChVectorDynamic<> *)&local_138);
      if (local_e8.super_ChVectorDynamic<double>.
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows <=
          (long)uVar10) goto LAB_0057f583;
      local_e8.super_ChVectorDynamic<double>.
      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[uVar10] =
           local_e8.super_ChVectorDynamic<double>.
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[uVar10] +
           -1e-05;
      if (local_138.m_storage.m_rows != local_128.m_storage.m_rows) goto LAB_0057f5a2;
      if (local_128.m_storage.m_rows < 0) goto LAB_0057f61e;
      pCVar2 = this->m_Jac;
      pdVar7 = (pCVar2->m_R).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_data;
      lVar9 = (pCVar2->m_R).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows;
      if (lVar9 < 0 && pdVar7 != (double *)0x0) goto LAB_0057f5ff;
      lVar3 = (pCVar2->m_R).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_cols;
      if (lVar3 <= lVar12) goto LAB_0057f5e0;
      if (lVar9 != local_128.m_storage.m_rows) goto LAB_0057f5c1;
      if (0 < lVar9) {
        pdVar7 = (double *)((long)pdVar7 + lVar11);
        lVar12 = 0;
        do {
          *pdVar7 = (local_138.m_storage.m_data[lVar12] - local_128.m_storage.m_data[lVar12]) *
                    -99999.99999999999;
          lVar12 = lVar12 + 1;
          pdVar7 = pdVar7 + lVar3;
        } while (lVar9 != lVar12);
      }
      uVar10 = uVar10 + 1;
      lVar11 = lVar11 + 8;
    } while (uVar10 != local_110);
  }
  if (local_138.m_storage.m_data != (double *)0x0) {
    free((void *)local_138.m_storage.m_data[-1]);
  }
  if (local_b8.super_ChVectorDynamic<double>.
      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
      (double *)0x0) {
    free((void *)local_b8.super_ChVectorDynamic<double>.
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[-1]
        );
  }
  if (local_a0.super_ChVectorDynamic<double>.
      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
      (double *)0x0) {
    free((void *)local_a0.super_ChVectorDynamic<double>.
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[-1]
        );
  }
  if (local_60.super_ChVectorDynamic<double>.
      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
      (double *)0x0) {
    free((void *)local_60.super_ChVectorDynamic<double>.
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[-1]
        );
  }
  if (local_48.super_ChVectorDynamic<double>.
      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
      (double *)0x0) {
    free((void *)local_48.super_ChVectorDynamic<double>.
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[-1]
        );
  }
  if (local_128.m_storage.m_data != (double *)0x0) {
    free((void *)local_128.m_storage.m_data[-1]);
  }
  if (local_e8.super_ChVectorDynamic<double>.
      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
      (double *)0x0) {
    free((void *)local_e8.super_ChVectorDynamic<double>.
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[-1]
        );
  }
  if (local_88.super_ChVectorDynamic<double>.
      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
      (double *)0x0) {
    free((void *)local_88.super_ChVectorDynamic<double>.
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[-1]
        );
  }
  if (local_100.super_ChVectorDynamic<double>.
      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
      (double *)0x0) {
    free((void *)local_100.super_ChVectorDynamic<double>.
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[-1]
        );
  }
  if (local_d0.super_ChVectorDynamic<double>.
      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
      (double *)0x0) {
    free((void *)local_d0.super_ChVectorDynamic<double>.
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[-1]
        );
  }
  return;
}

Assistant:

void CalculateJacobians(const ChMaterialCompositeSMC& mat) {
        // Compute a finite-difference approximations to the Jacobians of the contact forces and
        // load dQ/dx into m_Jac->m_K and dQ/dw into m_Jac->m_R.
        // Note that we only calculate these Jacobians whenever the contact force itself is calculated,
        // that is only once per step.  The Jacobian of generalized contact forces will therefore be
        // constant over the time step.

        // Get states for objA
        int ndofA_x = this->objA->ContactableGet_ndof_x();
        int ndofA_w = this->objA->ContactableGet_ndof_w();
        ChState stateA_x(ndofA_x, NULL);
        ChStateDelta stateA_w(ndofA_w, NULL);
        this->objA->ContactableGetStateBlock_x(stateA_x);
        this->objA->ContactableGetStateBlock_w(stateA_w);

        // Get states for objB
        int ndofB_x = this->objB->ContactableGet_ndof_x();
        int ndofB_w = this->objB->ContactableGet_ndof_w();
        ChState stateB_x(ndofB_x, NULL);
        ChStateDelta stateB_w(ndofB_w, NULL);
        this->objB->ContactableGetStateBlock_x(stateB_x);
        this->objB->ContactableGetStateBlock_w(stateB_w);

        // Compute Q at current state
        ChVectorDynamic<> Q0(ndofA_w + ndofB_w);
        CalculateQ(stateA_x, stateA_w, stateB_x, stateB_w, mat, Q0);

        // Finite-difference approximation perturbation.
        // Note that ChState and ChStateDelta are set to 0 on construction.
        // To accommodate objects with quaternion states, use the method ContactableIncrementState while
        // calculating Jacobian columns corresponding to position states.
        double perturbation = 1e-5;
        ChState stateA_x1(ndofA_x, NULL);
        ChState stateB_x1(ndofB_x, NULL);
        ChStateDelta prtrbA(ndofA_w, NULL);
        ChStateDelta prtrbB(ndofB_w, NULL);

        ChVectorDynamic<> Q1(ndofA_w + ndofB_w);

        // Jacobian w.r.t. variables of objA
        for (int i = 0; i < ndofA_w; i++) {
            prtrbA(i) += perturbation;
            this->objA->ContactableIncrementState(stateA_x, prtrbA, stateA_x1);
            CalculateQ(stateA_x1, stateA_w, stateB_x, stateB_w, mat, Q1);
            prtrbA(i) -= perturbation;

            m_Jac->m_K.col(i) = (Q1 - Q0) * (-1 / perturbation);  // note sign change

            stateA_w(i) += perturbation;
            CalculateQ(stateA_x, stateA_w, stateB_x, stateB_w, mat, Q1);
            stateA_w(i) -= perturbation;

            m_Jac->m_R.col(i) = (Q1 - Q0) * (-1 / perturbation);  // note sign change
        }

        // Jacobian w.r.t. variables of objB
        for (int i = 0; i < ndofB_w; i++) {
            prtrbB(i) += perturbation;
            this->objB->ContactableIncrementState(stateB_x, prtrbB, stateB_x1);
            CalculateQ(stateA_x, stateA_w, stateB_x1, stateB_w, mat, Q1);
            prtrbB(i) -= perturbation;

            m_Jac->m_K.col(ndofA_w + i) = (Q1 - Q0) * (-1 / perturbation);  // note sign change

            stateB_w(i) += perturbation;
            CalculateQ(stateA_x, stateA_w, stateB_x, stateB_w, mat, Q1);
            stateB_w(i) -= perturbation;

            m_Jac->m_R.col(ndofA_w + i) = (Q1 - Q0) * (-1 / perturbation);  // note sign change
        }
    }